

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

uint32_t spvtools::val::anon_unknown_0::getSize
                   (uint32_t member_id,LayoutConstraints *inherited,MemberConstraints *constraints,
                   ValidationState_t *vstate)

{
  uint16_t uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  const_iterator cVar9;
  Instruction *pIVar10;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar11;
  _Base_ptr p_Var12;
  mapped_type *inherited_00;
  _Rb_tree_color _Var13;
  int iVar14;
  _Rb_tree_color member_index;
  FieldDecorationsIter FVar15;
  key_type local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  iVar14 = 1;
LAB_0015f19f:
  pIVar8 = ValidationState_t::FindDef(vstate,member_id);
  uVar1 = (pIVar8->inst_).opcode;
  switch(uVar1) {
  case 0x15:
  case 0x16:
    uVar5 = (pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
LAB_0015f1fd:
    uVar7 = uVar5 >> 3;
    break;
  case 0x17:
    goto switchD_0015f1bf_caseD_17;
  case 0x18:
    puVar3 = (pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = puVar3[3];
    if (inherited->majorness == kColumnMajor) {
      uVar7 = uVar5 * inherited->matrix_stride;
    }
    else {
      pIVar8 = ValidationState_t::FindDef(vstate,puVar3[2]);
      puVar3 = (pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = puVar3[3];
      uVar7 = getSize(puVar3[2],inherited,constraints,vstate);
      uVar7 = uVar7 * uVar5 + (uVar2 - 1) * inherited->matrix_stride;
    }
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
    bVar4 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,BindlessTextureNV);
    if (!bVar4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0x128,
                    "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    uVar5 = ValidationState_t::samplerimage_variable_address_mode(vstate);
    goto LAB_0015f1fd;
  case 0x1c:
    pIVar10 = ValidationState_t::FindDef
                        (vstate,(pIVar8->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[3]);
    iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar10->inst_).opcode);
    uVar7 = 0;
    if (iVar6 != 0) break;
    if ((pIVar10->inst_).opcode != 0x2b) {
      __assert_fail("spv::Op::OpConstant == sizeInst->opcode()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0x138,
                    "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    uVar5 = (pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3];
    uVar7 = getSize((pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start[2],inherited,constraints,vstate);
    psVar11 = ValidationState_t::id_decorations(vstate,member_id);
    p_Var12 = (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    goto LAB_0015f318;
  case 0x1d:
    uVar7 = 0;
    break;
  case 0x1e:
    getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,member_id,
                     vstate);
    if (local_48._M_impl.super__Vector_impl_data._M_start ==
        local_48._M_impl.super__Vector_impl_data._M_finish) {
      uVar7 = 0;
    }
    else {
      member_index = (int)((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 2) -
                     _S_black;
      FVar15 = ValidationState_t::id_member_decorations(vstate,member_id,member_index);
      _Var13 = ~_S_red;
      for (cVar9 = FVar15.begin._M_node; cVar9._M_node != FVar15.end._M_node._M_node;
          cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node)) {
        if (cVar9._M_node[2]._M_color != member_index) {
          __assert_fail("decoration->struct_member_index() == (int)lastIdx",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                        ,0x160,
                        "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                       );
        }
        if (cVar9._M_node[1]._M_color == 0x23) {
          _Var13 = (cVar9._M_node[1]._M_parent)->_M_color;
        }
      }
      if (_Var13 == ~_S_red) {
        __assert_fail("offset != 0xffffffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x167,
                      "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                     );
      }
      local_50.second = member_index;
      local_50.first = local_48._M_impl.super__Vector_impl_data._M_finish[-1];
      inherited_00 = std::
                     unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                     ::operator[](constraints,&local_50);
      uVar7 = getSize(local_48._M_impl.super__Vector_impl_data._M_finish[-1],inherited_00,
                      constraints,vstate);
      uVar7 = uVar7 + _Var13;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    break;
  case 0x1f:
switchD_0015f1bf_caseD_1f:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x16f,
                  "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                 );
  default:
    if (uVar1 != 0x1141) goto switchD_0015f1bf_caseD_1f;
  case 0x20:
    uVar7 = vstate->pointer_size_and_alignment_;
  }
  goto LAB_0015f3d8;
LAB_0015f318:
  if ((_Rb_tree_header *)p_Var12 == &(psVar11->_M_t)._M_impl.super__Rb_tree_header)
  goto LAB_0015f3c5;
  if (p_Var12[1]._M_color == 6) {
    _Var13 = (p_Var12[1]._M_parent)->_M_color;
    goto LAB_0015f3d1;
  }
  p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
  goto LAB_0015f318;
switchD_0015f1bf_caseD_17:
  puVar3 = (pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  member_id = puVar3[2];
  iVar14 = iVar14 * puVar3[3];
  goto LAB_0015f19f;
LAB_0015f3c5:
  _Var13 = _S_red;
LAB_0015f3d1:
  uVar7 = _Var13 * (uVar5 - 1) + uVar7;
LAB_0015f3d8:
  return uVar7 * iVar14;
}

Assistant:

uint32_t getSize(uint32_t member_id, const LayoutConstraints& inherited,
                 MemberConstraints& constraints, ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(member_id);
  const auto& words = inst->words();
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      return words[2] / 8;
    case spv::Op::OpTypeVector: {
      const auto componentId = words[2];
      const auto numComponents = words[3];
      const auto componentSize =
          getSize(componentId, inherited, constraints, vstate);
      const auto size = componentSize * numComponents;
      return size;
    }
    case spv::Op::OpTypeArray: {
      const auto sizeInst = vstate.FindDef(words[3]);
      if (spvOpcodeIsSpecConstant(sizeInst->opcode())) return 0;
      assert(spv::Op::OpConstant == sizeInst->opcode());
      const uint32_t num_elem = sizeInst->words()[3];
      const uint32_t elem_type = words[2];
      const uint32_t elem_size =
          getSize(elem_type, inherited, constraints, vstate);
      // Account for gaps due to alignments in the first N-1 elements,
      // then add the size of the last element.
      const auto size =
          (num_elem - 1) * GetArrayStride(member_id, vstate) + elem_size;
      return size;
    }
    case spv::Op::OpTypeRuntimeArray:
      return 0;
    case spv::Op::OpTypeMatrix: {
      const auto num_columns = words[3];
      if (inherited.majorness == kColumnMajor) {
        return num_columns * inherited.matrix_stride;
      } else {
        // Row major case.
        const auto column_type = words[2];
        const auto component_inst = vstate.FindDef(column_type);
        const auto num_rows = component_inst->words()[3];
        const auto scalar_elem_type = component_inst->words()[2];
        const uint32_t scalar_elem_size =
            getSize(scalar_elem_type, inherited, constraints, vstate);
        return (num_rows - 1) * inherited.matrix_stride +
               num_columns * scalar_elem_size;
      }
    }
    case spv::Op::OpTypeStruct: {
      const auto& members = getStructMembers(member_id, vstate);
      if (members.empty()) return 0;
      const auto lastIdx = uint32_t(members.size() - 1);
      const auto& lastMember = members.back();
      uint32_t offset = 0xffffffff;
      // Find the offset of the last element and add the size.
      auto member_decorations =
          vstate.id_member_decorations(member_id, lastIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)lastIdx);
        if (spv::Decoration::Offset == decoration->dec_type()) {
          offset = decoration->params()[0];
        }
      }
      // This check depends on the fact that all members have offsets.  This
      // has been checked earlier in the flow.
      assert(offset != 0xffffffff);
      const auto& constraint = constraints[std::make_pair(lastMember, lastIdx)];
      return offset + getSize(lastMember, constraint, constraints, vstate);
    }
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      return vstate.pointer_size_and_alignment();
    default:
      assert(0);
      return 0;
  }
}